

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O1

void __thiscall streamer::Streamer::~Streamer(Streamer *this)

{
  pointer pcVar1;
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  avformat_network_deinit();
  pcVar1 = (this->config).server._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->config).server.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->config).profile._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->config).profile.field_2) {
    operator_delete(pcVar1);
  }
  Picture::~Picture(&this->picture);
  Scaler::~Scaler(&this->scaler);
  return;
}

Assistant:

Streamer::~Streamer()
{
    cleanup();
    avformat_network_deinit();
}